

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O3

int ReadHeader(BMP *bmp,FILE *f)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar little [4];
  int local_1c;
  
  iVar2 = 7;
  if (f != (FILE *)0x0 && bmp != (BMP *)0x0) {
    iVar1 = ReadUSHORT((unsigned_short *)bmp,f);
    iVar2 = 3;
    if (iVar1 != 0) {
      sVar3 = fread(&local_1c,4,1,(FILE *)f);
      if (sVar3 == 1) {
        (bmp->Header).FileSize = (long)local_1c;
        sVar3 = fread(&local_1c,2,1,(FILE *)f);
        if (sVar3 == 1) {
          (bmp->Header).Reserved1 = (unsigned_short)local_1c;
          sVar3 = fread(&local_1c,2,1,(FILE *)f);
          if (sVar3 == 1) {
            (bmp->Header).Reserved2 = (unsigned_short)local_1c;
            sVar3 = fread(&local_1c,4,1,(FILE *)f);
            if (sVar3 == 1) {
              (bmp->Header).DataOffset = (long)local_1c;
              sVar3 = fread(&local_1c,4,1,(FILE *)f);
              if (sVar3 == 1) {
                (bmp->Header).HeaderSize = (long)local_1c;
                sVar3 = fread(&local_1c,4,1,(FILE *)f);
                if (sVar3 == 1) {
                  (bmp->Header).Width = (long)local_1c;
                  iVar1 = ReadUINT(&(bmp->Header).Height,f);
                  if (iVar1 != 0) {
                    iVar1 = ReadUSHORT(&(bmp->Header).Planes,f);
                    if (iVar1 != 0) {
                      iVar1 = ReadUSHORT(&(bmp->Header).BitsPerPixel,f);
                      if (iVar1 != 0) {
                        iVar1 = ReadUINT(&(bmp->Header).CompressionType,f);
                        if (iVar1 != 0) {
                          iVar1 = ReadUINT(&(bmp->Header).ImageDataSize,f);
                          if (iVar1 != 0) {
                            iVar1 = ReadUINT(&(bmp->Header).HPixelsPerMeter,f);
                            if (iVar1 != 0) {
                              iVar1 = ReadUINT(&(bmp->Header).VPixelsPerMeter,f);
                              if (iVar1 != 0) {
                                iVar1 = ReadUINT(&(bmp->Header).ColorsUsed,f);
                                if (iVar1 != 0) {
                                  iVar2 = ReadUINT(&(bmp->Header).ColorsRequired,f);
                                  iVar2 = (uint)(iVar2 == 0) * 3;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int	ReadHeader( BMP* bmp, FILE* f )
{
	if ( bmp == NULL || f == NULL )
	{
		return BMP_INVALID_ARGUMENT;
	}

	/* The header's fields are read one by one, and converted from the format's
	little endian to the system's native representation. */
	if ( !ReadUSHORT( &( bmp->Header.Magic ), f ) )			return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.FileSize ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUSHORT( &( bmp->Header.Reserved1 ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUSHORT( &( bmp->Header.Reserved2 ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.DataOffset ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.HeaderSize ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.Width ), f ) )			return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.Height ), f ) )			return BMP_IO_ERROR;
	if ( !ReadUSHORT( &( bmp->Header.Planes ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUSHORT( &( bmp->Header.BitsPerPixel ), f ) )	return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.CompressionType ), f ) )	return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.ImageDataSize ), f ) )	return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.HPixelsPerMeter ), f ) )	return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.VPixelsPerMeter ), f ) )	return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.ColorsUsed ), f ) )		return BMP_IO_ERROR;
	if ( !ReadUINT( &( bmp->Header.ColorsRequired ), f ) )	return BMP_IO_ERROR;

	return BMP_OK;
}